

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  string *attribute;
  string *psVar4;
  string *in_RCX;
  string *in_RDX;
  JunitReporter *in_RSI;
  long in_RDI;
  byte in_R8B;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  ChildSections *__range1;
  ScopedElement e;
  string name;
  JunitReporter *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  ScopedElement *in_stack_fffffffffffffc20;
  ScopedElement *this_00;
  SectionNode *in_stack_fffffffffffffc28;
  JunitReporter *in_stack_fffffffffffffc30;
  XmlWriter *in_stack_fffffffffffffc38;
  double in_stack_fffffffffffffc58;
  allocator *paVar5;
  string *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  XmlWriter *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  XmlWriter *in_stack_fffffffffffffc80;
  undefined1 local_331 [33];
  reference local_310;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *local_308;
  __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  local_300;
  size_type *local_2f8;
  string local_2f0 [39];
  undefined1 local_2c9 [49];
  string local_298 [39];
  undefined1 local_271 [56];
  undefined1 local_239 [41];
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  undefined1 local_191 [40];
  undefined1 local_169 [40];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [64];
  string local_88 [32];
  string local_68 [32];
  string local_48 [31];
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffd8;
  JunitReporter *this_01;
  
  bVar1 = in_R8B & 1;
  trim((string *)in_stack_fffffffffffffc28);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc28,(char)((ulong)in_stack_fffffffffffffc20 >> 0x38));
    std::operator+(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    std::__cxx11::string::operator=(local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  bVar2 = clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::empty
                    ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)
                     in_stack_fffffffffffffc20);
  if (((!bVar2) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) ||
     (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"testcase",&local_c9);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffc38,(string *)in_stack_fffffffffffffc30,
               (XmlFormatting)((ulong)in_stack_fffffffffffffc28 >> 0x20));
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_fffffffffffffc80 = (XmlWriter *)(in_RDI + 0xd8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"classname",&local_141);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      in_stack_fffffffffffffc70 = (XmlWriter *)(in_RDI + 0xd8);
      in_stack_fffffffffffffc78 = (string *)local_169;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_169 + 1),"name",(allocator *)in_stack_fffffffffffffc78);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      std::__cxx11::string::~string((string *)(local_169 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_169);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"classname",&local_f1);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"name",&local_119);
      XmlWriter::writeAttribute<char[5]>
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 &in_stack_fffffffffffffc70->m_tagIsOpen);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    attribute = (string *)(in_RDI + 0xd8);
    psVar4 = (string *)local_191;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_191 + 1),"time",(allocator *)psVar4);
    (anonymous_namespace)::formatDuration_abi_cxx11_(in_stack_fffffffffffffc58);
    XmlWriter::writeAttribute(in_stack_fffffffffffffc70,psVar4,attribute);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::string::~string((string *)(local_191 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_191);
    paVar5 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"status",paVar5);
    XmlWriter::writeAttribute<char[4]>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               &in_stack_fffffffffffffc70->m_tagIsOpen);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    if (in_RCX[3].field_2._M_allocated_capacity != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"skipped",(allocator *)(local_239 + 0x28));
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                (in_stack_fffffffffffffc38,(string *)in_stack_fffffffffffffc30,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffc28 >> 0x20));
      in_stack_fffffffffffffc38 = (XmlWriter *)local_239;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_239 + 1),"message",(allocator *)in_stack_fffffffffffffc38);
      XmlWriter::ScopedElement::writeAttribute<char[31]>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (char (*) [31])in_stack_fffffffffffffc10);
      std::__cxx11::string::~string((string *)(local_239 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_239);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)(local_239 + 0x28));
    }
    writeAssertions(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_fffffffffffffc28 = (SectionNode *)(in_RDI + 0xd8);
      in_stack_fffffffffffffc30 = (JunitReporter *)local_271;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_271 + 1),"system-out",(allocator *)in_stack_fffffffffffffc30);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                (in_stack_fffffffffffffc38,(string *)in_stack_fffffffffffffc30,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffc28 >> 0x20));
      trim((string *)in_stack_fffffffffffffc28);
      XmlWriter::ScopedElement::writeText
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffc10 >> 0x20));
      std::__cxx11::string::~string(local_298);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string((string *)(local_271 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_271);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      psVar4 = (string *)(in_RDI + 0xd8);
      this_00 = (ScopedElement *)local_2c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_2c9 + 1),"system-err",(allocator *)this_00);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                (in_stack_fffffffffffffc38,(string *)in_stack_fffffffffffffc30,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffc28 >> 0x20));
      trim((string *)in_stack_fffffffffffffc28);
      XmlWriter::ScopedElement::writeText
                (this_00,psVar4,(XmlFormatting)((ulong)in_stack_fffffffffffffc10 >> 0x20));
      std::__cxx11::string::~string(local_2f0);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string((string *)(local_2c9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2c9);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc10);
  }
  local_2f8 = &in_RCX[4]._M_string_length;
  local_300._M_current =
       (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
       clara::std::
       vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
       ::begin((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                *)in_stack_fffffffffffffc08);
  local_308 = (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              clara::std::
              vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
              ::end((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                     *)in_stack_fffffffffffffc08);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffc10,
                            (__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffc08), bVar2) {
    local_310 = __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                ::operator*(&local_300);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      this_01 = in_RSI;
      clara::std::
      __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffc10);
      writeSection(this_01,in_RDX,in_RCX,(SectionNode *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                   (bool)in_stack_ffffffffffffffd7);
      in_stack_fffffffffffffc08 = in_RSI;
      in_RSI = this_01;
    }
    else {
      in_stack_fffffffffffffc10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_331;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_331 + 1),"",(allocator *)in_stack_fffffffffffffc10);
      clara::std::
      __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffc10);
      writeSection(in_RSI,in_RDX,in_RCX,(SectionNode *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                   (bool)in_stack_ffffffffffffffd7);
      std::__cxx11::string::~string((string *)(local_331 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_331);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
    ::operator++(&local_300);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( !sectionNode.assertions.empty() ||
            !sectionNode.stdOut.empty() ||
            !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname", name );
                xml.writeAttribute( "name", "root" );
            }
            else {
                xml.writeAttribute( "classname", className );
                xml.writeAttribute( "name", name );
            }
            xml.writeAttribute( "time", formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status", "run" );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );

            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }